

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

bool __thiscall
wasm::OptimizeInstructions::optimizeSubsequentStructSet
          (OptimizeInstructions *this,StructNew *new_,StructSet *set,Index refLocalIndex)

{
  Expression *pEVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  Expression **ppEVar5;
  Module *wasm;
  Drop *left;
  Block *pBVar6;
  bool local_4b1;
  EffectAnalyzer local_4b0;
  Builder local_340;
  Builder builder;
  EffectAnalyzer operandEffects;
  Index i;
  undefined1 local_1b0 [8];
  EffectAnalyzer setValueEffects;
  ExpressionList *operands;
  Index index;
  Index local_2c;
  StructSet *pSStack_28;
  Index refLocalIndex_local;
  StructSet *set_local;
  StructNew *new__local;
  OptimizeInstructions *this_local;
  
  index = 1;
  local_2c = refLocalIndex;
  pSStack_28 = set;
  set_local = (StructSet *)new_;
  new__local = (StructNew *)this;
  bVar2 = wasm::Type::operator==
                    (&(new_->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.
                      type,&index);
  local_4b1 = true;
  if (!bVar2) {
    operands._4_4_ = 1;
    local_4b1 = wasm::Type::operator==
                          (&(pSStack_28->super_SpecificExpression<(wasm::Expression::Id)62>).
                            super_Expression.type,(BasicType *)((long)&operands + 4));
  }
  if (local_4b1 == false) {
    bVar2 = StructNew::isWithDefault((StructNew *)set_local);
    if (bVar2) {
      this_local._7_1_ = 0;
    }
    else {
      operands._0_4_ = pSStack_28->index;
      setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&set_local->index;
      effects((EffectAnalyzer *)local_1b0,this,pSStack_28->value);
      sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&setValueEffects.features,&local_2c);
      if ((sVar3 == 0) &&
         (sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count,&local_2c),
         operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
              (Index)operands, sVar3 == 0)) {
        do {
          operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
               operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
               + 1;
          sVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count);
          if (sVar4 <= operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count._4_4_) {
            wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   ::getModule(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              );
            Builder::Builder(&local_340,wasm);
            ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)setValueEffects.delegateTargets._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count,(ulong)(Index)operands);
            effects(&local_4b0,this,*ppEVar5);
            bVar2 = EffectAnalyzer::hasUnremovableSideEffects(&local_4b0);
            EffectAnalyzer::~EffectAnalyzer(&local_4b0);
            if (bVar2) {
              ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                    *)setValueEffects.delegateTargets._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count,(ulong)(Index)operands);
              left = Builder::makeDrop(&local_340,*ppEVar5);
              pBVar6 = Builder::makeSequence(&local_340,(Expression *)left,pSStack_28->value);
              ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                    *)setValueEffects.delegateTargets._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count,(ulong)(Index)operands);
              *ppEVar5 = (Expression *)pBVar6;
            }
            else {
              pEVar1 = pSStack_28->value;
              ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                    *)setValueEffects.delegateTargets._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count,(ulong)(Index)operands);
              *ppEVar5 = pEVar1;
            }
            this_local._7_1_ = 1;
            break;
          }
          ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header
                                  ._M_node_count,
                               (ulong)operandEffects.delegateTargets._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count._4_4_);
          effects((EffectAnalyzer *)&builder,this,*ppEVar5);
          bVar2 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)&builder,(EffectAnalyzer *)local_1b0);
          if (bVar2) {
            this_local._7_1_ = 0;
          }
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&builder);
        } while (!bVar2);
      }
      else {
        this_local._7_1_ = 0;
      }
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1b0);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool optimizeSubsequentStructSet(StructNew* new_,
                                   StructSet* set,
                                   Index refLocalIndex) {
    // Leave unreachable code for DCE, to avoid updating types here.
    if (new_->type == Type::unreachable || set->type == Type::unreachable) {
      return false;
    }

    if (new_->isWithDefault()) {
      // Ignore a new_default for now. If the fields are defaultable then we
      // could add them, in principle, but that might increase code size.
      return false;
    }

    auto index = set->index;
    auto& operands = new_->operands;

    // Check for effects that prevent us moving the struct.set's value (X' in
    // the function comment) into its new position in the struct.new. First, it
    // must be ok to move it past the local.set (otherwise, it might read from
    // memory using that local, and depend on the struct.new having already
    // occurred; or, if it writes to that local, then it would cross another
    // write).
    auto setValueEffects = effects(set->value);
    if (setValueEffects.localsRead.count(refLocalIndex) ||
        setValueEffects.localsWritten.count(refLocalIndex)) {
      return false;
    }

    // We must move the set's value past indexes greater than it (Y and Z in
    // the example in the comment on this function).
    // TODO When this function is called repeatedly in a sequence this can
    //      become quadratic - perhaps we should memoize (though, struct sizes
    //      tend to not be ridiculously large).
    for (Index i = index + 1; i < operands.size(); i++) {
      auto operandEffects = effects(operands[i]);
      if (operandEffects.invalidates(setValueEffects)) {
        // TODO: we could use locals to reorder everything
        return false;
      }
    }

    Builder builder(*getModule());

    // See if we need to keep the old value.
    if (effects(operands[index]).hasUnremovableSideEffects()) {
      operands[index] =
        builder.makeSequence(builder.makeDrop(operands[index]), set->value);
    } else {
      operands[index] = set->value;
    }

    return true;
  }